

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O1

void __thiscall chrono::ChBody::UpdateForces(ChBody *this,double mytime)

{
  double dVar1;
  double dVar2;
  double dVar3;
  pointer psVar4;
  ChSystem *pCVar5;
  shared_ptr<chrono::ChForce> *force;
  pointer psVar6;
  ChVector<double> mtorque;
  ChVector<double> mforce;
  ChVector<double> local_68;
  ChVector<double> local_48;
  double local_30;
  
  dVar1 = (this->Force_acc).m_data[1];
  (this->Xforce).m_data[0] = (this->Force_acc).m_data[0];
  (this->Xforce).m_data[1] = dVar1;
  dVar1 = (this->Torque_acc).m_data[0];
  dVar2 = (this->Torque_acc).m_data[1];
  dVar3 = (this->Torque_acc).m_data[2];
  (this->Xforce).m_data[2] = (this->Force_acc).m_data[2];
  (this->Xtorque).m_data[0] = dVar1;
  (this->Xtorque).m_data[1] = dVar2;
  (this->Xtorque).m_data[2] = dVar3;
  local_48.m_data[2] = 0.0;
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  local_68.m_data[2] = 0.0;
  local_68.m_data[0] = 0.0;
  local_68.m_data[1] = 0.0;
  psVar6 = (this->forcelist).
           super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (this->forcelist).
           super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar6 != psVar4) {
    local_30 = mytime;
    do {
      ChForce::Update((psVar6->super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr,local_30);
      ChForce::GetBodyForceTorque
                ((psVar6->super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                 &local_48,&local_68);
      (this->Xforce).m_data[0] = local_48.m_data[0] + (this->Xforce).m_data[0];
      (this->Xforce).m_data[1] = local_48.m_data[1] + (this->Xforce).m_data[1];
      (this->Xforce).m_data[2] = local_48.m_data[2] + (this->Xforce).m_data[2];
      (this->Xtorque).m_data[0] = local_68.m_data[0] + (this->Xtorque).m_data[0];
      (this->Xtorque).m_data[1] = local_68.m_data[1] + (this->Xtorque).m_data[1];
      (this->Xtorque).m_data[2] = local_68.m_data[2] + (this->Xtorque).m_data[2];
      psVar6 = psVar6 + 1;
    } while (psVar6 != psVar4);
  }
  pCVar5 = (this->super_ChPhysicsItem).system;
  if (pCVar5 != (ChSystem *)0x0) {
    dVar1 = (this->variables).mass;
    dVar2 = (pCVar5->G_acc).m_data[1];
    dVar3 = (pCVar5->G_acc).m_data[2];
    (this->Xforce).m_data[0] = dVar1 * (pCVar5->G_acc).m_data[0] + (this->Xforce).m_data[0];
    (this->Xforce).m_data[1] = dVar1 * dVar2 + (this->Xforce).m_data[1];
    (this->Xforce).m_data[2] = dVar1 * dVar3 + (this->Xforce).m_data[2];
  }
  return;
}

Assistant:

void ChBody::UpdateForces(double mytime) {
    // Initialize body force (in abs. coords) and torque (in local coords)
    // with current values from the accumulators.
    Xforce = Force_acc;
    Xtorque = Torque_acc;

    // Accumulate other applied forces
    ChVector<> mforce;
    ChVector<> mtorque;

    for (auto& force : forcelist) {
        // update positions, f=f(t,q)
        force->Update(mytime);

        force->GetBodyForceTorque(mforce, mtorque);
        Xforce += mforce;
        Xtorque += mtorque;
    }

    // Add gravitational forces
    if (system) {
        Xforce += system->Get_G_acc() * GetMass();
    }
}